

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_parser_t * mpc_real(void)

{
  mpc_parser_t *pmVar1;
  mpc_parser_t *pmVar2;
  mpc_parser_t *pmVar3;
  mpc_parser_t *pmVar4;
  mpc_parser_t *pmVar5;
  mpc_parser_t *pmVar6;
  
  pmVar1 = mpc_oneof("+-");
  pmVar1 = mpc_maybe_lift(pmVar1,mpcf_ctor_str);
  pmVar2 = mpc_digits();
  pmVar3 = mpc_char('.');
  pmVar4 = mpc_digits();
  pmVar3 = mpc_and(2,mpcf_strfold,pmVar3,pmVar4,free);
  pmVar3 = mpc_maybe_lift(pmVar3,mpcf_ctor_str);
  pmVar4 = mpc_oneof("eE");
  pmVar5 = mpc_oneof("+-");
  pmVar5 = mpc_maybe_lift(pmVar5,mpcf_ctor_str);
  pmVar6 = mpc_digits();
  pmVar4 = mpc_and(3,mpcf_strfold,pmVar4,pmVar5,pmVar6,free,free);
  pmVar4 = mpc_maybe_lift(pmVar4,mpcf_ctor_str);
  pmVar1 = mpc_and(4,mpcf_strfold,pmVar1,pmVar2,pmVar3,pmVar4,free,free,free);
  pmVar1 = mpc_expect(pmVar1,"real");
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_real(void) {

  /* [+-]?\d+(\.\d+)?([eE][+-]?[0-9]+)? */

  mpc_parser_t *p0, *p1, *p2, *p30, *p31, *p32, *p3;

  p0 = mpc_maybe_lift(mpc_oneof("+-"), mpcf_ctor_str);
  p1 = mpc_digits();
  p2 = mpc_maybe_lift(mpc_and(2, mpcf_strfold, mpc_char('.'), mpc_digits(), free), mpcf_ctor_str);
  p30 = mpc_oneof("eE");
  p31 = mpc_maybe_lift(mpc_oneof("+-"), mpcf_ctor_str);
  p32 = mpc_digits();
  p3 = mpc_maybe_lift(mpc_and(3, mpcf_strfold, p30, p31, p32, free, free), mpcf_ctor_str);

  return mpc_expect(mpc_and(4, mpcf_strfold, p0, p1, p2, p3, free, free, free), "real");

}